

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O2

int coda_get_params_buf(coda_params_t *params,char *s,size_t len)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  string key;
  
  if (s == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar5 = s + len;
    while (s < pcVar5) {
      pcVar2 = coda_strnchr(s,'&',(long)pcVar5 - (long)s);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = pcVar5;
      }
      pcVar3 = coda_strnchr(s,'=',(long)pcVar5 - (long)s);
      if (pcVar3 < pcVar2 && pcVar3 != (char *)0x0) {
        key._M_dataplus._M_p = (pointer)&key.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&key,s,pcVar3);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](params,&key);
        std::__cxx11::string::assign((char *)pmVar4,(ulong)(pcVar3 + 1));
        std::__cxx11::string::~string((string *)&key);
      }
      s = pcVar2 + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_get_params_buf(coda_params_t& params, const char* s, size_t len)
{
	if (!s) return -1;

	const char* e = s + len;

	while (s < e)
	{
		const char* amp = coda_strnchr(s, '&', e - s);
		if (NULL == amp) amp = e;

		const char* equ = coda_strnchr(s, '=', e - s);
		if (NULL != equ && equ < amp)
		{
			std::string key (s, equ - s);
			params[key].assign(equ + 1, amp - equ - 1);
		}

		s = amp + 1;
	}

	return 0;
}